

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O0

bool __thiscall nite::Texture::load(Texture *this,string *path,Color *transparency)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  Color *pCVar5;
  bool bVar6;
  int iVar7;
  nite *this_00;
  char *pcVar8;
  reference pvVar9;
  size_t in_RCX;
  int number;
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  uchar *local_130;
  uchar *a;
  uchar *b;
  uchar *g;
  uchar *r;
  Color *tr;
  undefined1 local_100 [4];
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  uchar *local_c0;
  GLubyte *Pixels;
  int Channels;
  int Height;
  int Width;
  Texture *local_a0;
  undefined1 local_98 [8];
  string fileHash;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  Color *local_28;
  Color *transparency_local;
  string *path_local;
  Texture *this_local;
  
  local_28 = transparency;
  transparency_local = (Color *)path;
  path_local = &this->filename;
  bVar6 = fileExists(path);
  if (bVar6) {
    unload(this);
    this_00 = (nite *)std::__cxx11::string::c_str();
    pcVar8 = (char *)std::__cxx11::string::length();
    hashMemory_abi_cxx11_((string *)local_98,this_00,pcVar8,in_RCX);
    iVar7 = getSlotByHash((string *)local_98);
    this->objectId = iVar7;
    if ((uint)this->objectId < 0x80000000) {
      pvVar9 = std::vector<textureT,_std::allocator<textureT>_>::operator[]
                         (&textureList,(long)this->objectId);
      _Width = this;
      std::vector<nite::Texture_*,_std::allocator<nite::Texture_*>_>::push_back
                (&pvVar9->owners,(value_type *)&Width);
      pvVar9 = std::vector<textureT,_std::allocator<textureT>_>::operator[]
                         (&textureList,(long)this->objectId);
      iVar7 = pvVar9->Width;
      pvVar9 = std::vector<textureT,_std::allocator<textureT>_>::operator[]
                         (&textureList,(long)this->objectId);
      Rect::set(&this->region,0.0,0.0,(float)iVar7,(float)pvVar9->Height);
      this_local._7_1_ = 0;
    }
    else {
      iVar7 = getEmptySlot();
      this->objectId = iVar7;
      pvVar9 = std::vector<textureT,_std::allocator<textureT>_>::operator[]
                         (&textureList,(long)this->objectId);
      pvVar9->empty = false;
      pvVar9 = std::vector<textureT,_std::allocator<textureT>_>::operator[]
                         (&textureList,(long)this->objectId);
      local_a0 = this;
      std::vector<nite::Texture_*,_std::allocator<nite::Texture_*>_>::push_back
                (&pvVar9->owners,&local_a0);
      pvVar9 = std::vector<textureT,_std::allocator<textureT>_>::operator[]
                         (&textureList,(long)this->objectId);
      std::__cxx11::string::operator=((string *)&pvVar9->Hash,(string *)local_98);
      pCVar5 = transparency_local;
      pvVar9 = std::vector<textureT,_std::allocator<textureT>_>::operator[]
                         (&textureList,(long)this->objectId);
      std::__cxx11::string::operator=((string *)&pvVar9->filename,(string *)pCVar5);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      local_c0 = SOIL_load_image(pcVar8,&Channels,(int *)((long)&Pixels + 4),(int *)&Pixels,0);
      if (local_c0 == (uchar *)0x0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_100,"failed to load texture \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       transparency_local);
        std::operator+(&local_e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_100,"\': unsupported format");
        print(&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)local_100);
        this_local._7_1_ = 0;
      }
      else {
        if ((local_28->a != -1.0) || (NAN(local_28->a))) {
          for (tr._4_4_ = 0; tr._4_4_ < Channels * Pixels._4_4_ * (int)Pixels;
              tr._4_4_ = tr._4_4_ + 4) {
            r = (uchar *)local_28;
            g = local_c0 + tr._4_4_;
            b = local_c0 + (tr._4_4_ + 1);
            a = local_c0 + (tr._4_4_ + 2);
            local_130 = local_c0 + (tr._4_4_ + 3);
            fVar1 = local_28->r * 255.0;
            if (((float)*g == fVar1) && (!NAN((float)*g) && !NAN(fVar1))) {
              fVar1 = local_28->g * 255.0;
              if (((float)*b == fVar1) && (!NAN((float)*b) && !NAN(fVar1))) {
                fVar1 = local_28->b * 255.0;
                if (((float)*a == fVar1) && (!NAN((float)*a) && !NAN(fVar1))) {
                  *g = 0;
                  *b = 0;
                  *a = 0;
                  *local_130 = '\0';
                }
              }
            }
          }
        }
        glEnable(0xde1);
        glTexParameteri(0xde1,0x2800,0x2600);
        glTexParameteri(0xde1,0x2801,0x2600);
        glTexParameterf(0x47012f00,0xde1,0x2802);
        glTexParameterf(0x47012f00,0xde1,0x2803);
        pvVar9 = std::vector<textureT,_std::allocator<textureT>_>::operator[]
                           (&textureList,(long)this->objectId);
        glGenTextures(1,pvVar9);
        pvVar9 = std::vector<textureT,_std::allocator<textureT>_>::operator[]
                           (&textureList,(long)this->objectId);
        glBindTexture(0xde1,pvVar9->texture);
        glTexImage2D(0xde1,0,0x1908,Channels,Pixels._4_4_,0,0x1908,0x1401,local_c0);
        glBindTexture(0xde1,0);
        glDisable(0xde1);
        iVar7 = this->objectId;
        pvVar9 = std::vector<textureT,_std::allocator<textureT>_>::operator[]
                           (&textureList,(long)iVar7);
        iVar4 = Channels;
        pvVar9->id = iVar7;
        pvVar9 = std::vector<textureT,_std::allocator<textureT>_>::operator[]
                           (&textureList,(long)this->objectId);
        iVar7 = Pixels._4_4_;
        pvVar9->Width = iVar4;
        pvVar9 = std::vector<textureT,_std::allocator<textureT>_>::operator[]
                           (&textureList,(long)this->objectId);
        pvVar9->Height = iVar7;
        pvVar9 = std::vector<textureT,_std::allocator<textureT>_>::operator[]
                           (&textureList,(long)this->objectId);
        pCVar5 = local_28;
        pvVar9->Channels = (int)Pixels;
        pvVar9 = std::vector<textureT,_std::allocator<textureT>_>::operator[]
                           (&textureList,(long)this->objectId);
        fVar1 = pCVar5->g;
        fVar2 = pCVar5->b;
        fVar3 = pCVar5->a;
        (pvVar9->transparency).r = pCVar5->r;
        (pvVar9->transparency).g = fVar1;
        (pvVar9->transparency).b = fVar2;
        (pvVar9->transparency).a = fVar3;
        std::__cxx11::string::operator=((string *)this,(string *)transparency_local);
        Rect::set(&this->region,0.0,0.0,(float)Channels,(float)Pixels._4_4_);
        std::operator+(&local_1b0,"loaded texture \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       transparency_local);
        std::operator+(&local_190,&local_1b0,"\'(");
        toStr_abi_cxx11_(&local_1d0,(nite *)(ulong)(uint)this->objectId,number);
        std::operator+(&local_170,&local_190,&local_1d0);
        std::operator+(&local_150,&local_170,")");
        print(&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&local_1b0);
        SOIL_free_image_data(local_c0);
        this_local._7_1_ = 1;
      }
    }
    Height = 1;
    std::__cxx11::string::~string((string *)local_98);
  }
  else {
    std::operator+(&local_68,"fail to load texture \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   transparency_local);
    std::operator+(&local_48,&local_68,"\': it doesn\'t exist");
    print(&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool nite::Texture::load(const String &path, const nite::Color &transparency){
	if(!nite::fileExists(path)){
		nite::print("fail to load texture '"+path+"': it doesn't exist");
		return false;
	}
	unload();
	String fileHash = nite::hashMemory((char*)path.c_str(), path.length());
	objectId = getSlotByHash(fileHash);
	if (objectId <= -1){
		objectId = getEmptySlot();
		textureList[objectId].empty = 0;
		textureList[objectId].owners.push_back(this);
		textureList[objectId].Hash = fileHash;
    	textureList[objectId].filename = path;
	}else{
		textureList[objectId].owners.push_back(this);
		region.set(0, 0, textureList[objectId].Width, textureList[objectId].Height);
		return false;
	}

	int Width;
	int Height;
	int Channels;
	GLubyte *Pixels = SOIL_load_image(path.c_str(), &Width, &Height, &Channels, SOIL_LOAD_AUTO);
	if (Pixels == NULL){
		nite::print("failed to load texture '"+path+"': unsupported format");
		return false;
	}
	if(transparency.a != -1.0){
		for(int i = 0; i < Width * Height * Channels; i += 4){
			const nite::Color &tr = transparency;
			#define uchar unsigned char
			uchar &r = Pixels[i];
			uchar &g = Pixels[i + 1];
			uchar &b = Pixels[i + 2];
			uchar &a = Pixels[i + 3];
			if(r == (tr.r * 255.0) && g == (tr.g * 255.0) && b == (tr.b * 255.0)){
				r = 0; g = 0;	b = 0; a = 0;
			}
		}
	}
	glEnable(GL_TEXTURE_2D);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
	glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
	glGenTextures(1, &textureList[objectId].texture);
	glBindTexture(GL_TEXTURE_2D, textureList[objectId].texture);
	glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, Width, Height, 0, GL_RGBA, GL_UNSIGNED_BYTE, Pixels);
	glBindTexture(GL_TEXTURE_2D, 0);
	glDisable(GL_TEXTURE_2D);
	textureList[objectId].id = objectId;
	textureList[objectId].Width	= Width;
	textureList[objectId].Height = Height;
	textureList[objectId].Channels = Channels;
	textureList[objectId].transparency = transparency;
	this->filename = path;
	region.set(0, 0, Width, Height);
	nite::print("loaded texture '"+path+"'("+nite::toStr(objectId)+")");
	SOIL_free_image_data(Pixels);
	return true;
}